

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,_testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSignedUsingEcdsa,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Expired,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetNotEndEntity,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyUsage,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  string *psVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *pCVar10;
  long *plVar11;
  size_t sVar12;
  TestFactoryBase *pTVar13;
  undefined8 *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined8 extraout_RAX_00;
  ulong *puVar16;
  size_type *psVar17;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *extraout_RDX_10;
  type_info *extraout_RDX_11;
  type_info *extraout_RDX_12;
  type_info *extraout_RDX_13;
  type_info *extraout_RDX_14;
  type_info *ptVar18;
  char *pcVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  char *pcVar22;
  CodeLocation *pCVar23;
  _Alloc_hider _Var24;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_3;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  CodeLocation local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  GTestLog local_364;
  string local_360;
  string local_340;
  int local_320;
  string local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  pointer local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  uint local_2d8;
  string local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  long local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  int local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  pointer local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  uint local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  pointer local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  CodeLocation *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  long local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  int local_218;
  TypedTestSuitePState *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  long local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  int local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  pointer local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  long local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  CodeLocation *local_f0;
  size_type local_e8;
  undefined1 local_e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  key_type local_b0;
  key_type local_90;
  undefined1 local_70 [17];
  undefined7 uStack_5f;
  undefined8 uStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_210 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
  pcVar8 = strchr((char *)code_location,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,(char *)code_location,(allocator<char> *)&local_3b0);
  }
  else {
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,code_location,pcVar8);
  }
  local_e0._16_8_ = local_150;
  local_240 = code_location;
  if (local_148 != 0) {
    pcVar8 = local_150->_M_local_buf + local_148;
    do {
      paVar15 = local_150;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_e0._16_8_ = paVar15;
      if (iVar7 == 0) break;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pcVar8 + -1);
      uVar20 = (long)paVar21 - (long)paVar15;
      std::__cxx11::string::_M_erase((ulong)&local_150,uVar20);
      pcVar8 = local_150->_M_local_buf + uVar20;
      local_e0._16_8_ = local_150;
    } while (paVar21 != paVar15);
  }
  local_150 = &local_140;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._16_8_ == local_150) {
    local_c0._8_8_ = local_140._8_8_;
    local_e0._16_8_ = &local_c0;
  }
  local_c0._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
  local_c0._M_local_buf[0] = local_140._M_local_buf[0];
  local_e0._24_8_ = local_148;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                  *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 8)
                 ,(key_type *)(local_e0 + 0x10));
  iVar7 = 0x6e2348;
  if (cVar9._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)
     ) {
    FormatFileLocation_abi_cxx11_
              (&local_3b0.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6e2348
              );
    TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSignedUsingEcdsa,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Expired,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetNotEndEntity,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
    ::Register();
LAB_00442214:
    FormatFileLocation_abi_cxx11_
              (&local_3b0.file,(internal *)local_178->_M_local_buf,(char *)(ulong)local_158,iVar7);
    TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSignedUsingEcdsa,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Expired,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetNotEndEntity,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
    ::Register();
  }
  else {
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                         (string *)(local_e0 + 0x10));
    local_1a0 = &local_190;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_180 = pCVar10->line;
    local_288 = &local_278;
    local_318._M_dataplus._M_p = (pointer)0x16;
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)&local_318);
    local_278._M_allocated_capacity = (size_type)local_318._M_dataplus._M_p;
    local_288->_M_allocated_capacity = 0x6543796669726556;
    *(char *)((long)local_288 + 8) = 'r';
    *(char *)((long)local_288 + 9) = 't';
    *(char *)((long)local_288 + 10) = 'i';
    *(char *)((long)local_288 + 0xb) = 'f';
    *(char *)((long)local_288 + 0xc) = 'i';
    *(char *)((long)local_288 + 0xd) = 'c';
    *(char *)((long)local_288 + 0xe) = 'a';
    *(char *)((long)local_288 + 0xf) = 't';
    *(char *)((long)local_288 + 0xe) = 'a';
    *(char *)((long)local_288 + 0xf) = 't';
    *(char *)((long)local_288 + 0x10) = 'e';
    *(char *)((long)local_288 + 0x11) = 'C';
    *(char *)((long)local_288 + 0x12) = 'h';
    *(char *)((long)local_288 + 0x13) = 'a';
    *(char *)((long)local_288 + 0x14) = 'i';
    *(char *)((long)local_288 + 0x15) = 'n';
    local_280 = local_318._M_dataplus._M_p;
    local_288->_M_local_buf[(long)local_318._M_dataplus._M_p] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    pCVar10 = local_240;
    local_238 = &local_228;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_228._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_228._8_8_ = plVar11[3];
    }
    else {
      local_228._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_230 = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_2f8 = &local_2e8;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2e8._8_8_ = plVar11[3];
    }
    else {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2f0 = (pointer)plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2b0 = &local_2a0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_2a0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2a0._8_8_ = plVar11[3];
    }
    else {
      local_2a0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2a8 = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_2b0,**(ulong **)local_210);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_340.field_2._M_allocated_capacity = *puVar16;
      local_340.field_2._8_8_ = plVar11[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar16;
      local_340._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_340._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,(char *)pCVar10,(allocator<char> *)&local_360);
      ptVar18 = extraout_RDX_00;
    }
    else {
      local_388 = &local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,pCVar10,pcVar8);
      ptVar18 = extraout_RDX;
    }
    paVar15 = local_388;
    if (local_380 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = local_380->_M_local_buf + (long)local_388;
      do {
        paVar21 = local_388;
        iVar7 = isspace((uint)(byte)pcVar8[-1]);
        ptVar18 = extraout_RDX_01;
        paVar15 = paVar21;
        if (iVar7 == 0) break;
        pcVar19 = pcVar8 + -1;
        uVar20 = (long)pcVar19 - (long)paVar21;
        std::__cxx11::string::_M_erase((ulong)&local_388,uVar20);
        pcVar8 = local_388->_M_local_buf + uVar20;
        ptVar18 = extraout_RDX_02;
        paVar15 = local_388;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar19 != paVar21);
    }
    local_388 = &local_378;
    if (paVar15 == local_388) {
      local_318.field_2._8_8_ = local_378._8_8_;
      paVar15 = &local_318.field_2;
    }
    local_318.field_2._M_allocated_capacity = local_378._M_allocated_capacity;
    local_318._M_string_length = (size_type)local_380;
    local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_378._M_allocated_capacity = local_378._M_allocated_capacity & 0xffffffffffffff00;
    local_318._M_dataplus._M_p = (pointer)paVar15;
    GetTypeName_abi_cxx11_
              (&local_360,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate::typeinfo,ptVar18);
    _Var24._M_p = local_360._M_dataplus._M_p;
    local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0,local_1a0,local_198 + (long)local_1a0);
    iVar7 = local_180;
    paVar21 = local_1a0;
    local_3b0.line = local_180;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar21->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_2d0);
    }
    iVar7 = local_180;
    paVar21 = local_1a0;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar21->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_2d0);
    }
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006d0778;
    MakeAndRegisterTestInfo
              (&local_340,paVar15->_M_local_buf,_Var24._M_p,(char *)0x0,&local_3b0,
               &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
      operator_delete(local_3b0.file._M_dataplus._M_p,
                      local_3b0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228._M_allocated_capacity + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278._M_allocated_capacity + 1);
    }
    if (local_1a0 == &local_190) {
      local_1b8._8_8_ = local_190._8_8_;
      local_1a0 = &local_1b8;
    }
    local_1b8._M_allocated_capacity._1_7_ = local_190._M_allocated_capacity._1_7_;
    local_1b8._M_local_buf[0] = local_190._M_local_buf[0];
    local_1c0 = local_198;
    local_198 = 0;
    local_190._M_local_buf[0] = '\0';
    local_1a8 = local_180;
    pCVar10 = local_240;
    local_1c8 = local_1a0;
    paVar15 = &local_190;
    if ((local_1a0 != &local_1b8) &&
       (paVar15 = local_1a0, local_1a0 = &local_190,
       operator_delete(paVar15,local_1b8._M_allocated_capacity + 1), pCVar10 = local_240,
       paVar15 = local_1a0, local_1a0 != &local_190)) {
      operator_delete(local_1a0,
                      CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1)
      ;
      paVar15 = local_1a0;
    }
    local_1a0 = paVar15;
    local_178 = &local_168;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(prefix + 0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)prefix == paVar15) {
      local_168._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_168._8_8_ = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_168._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_178 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)prefix;
    }
    local_170 = *(pointer *)(prefix + 8);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)prefix = paVar15;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_158 = *(uint *)(prefix + 0x20);
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
    pcVar19 = strchr(pcVar8,0x2c);
    if (pcVar19 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,pcVar8,(allocator<char> *)&local_3b0);
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar8,pcVar19);
    }
    local_b0._M_dataplus._M_p = (pointer)local_130;
    if (local_128 != 0) {
      pcVar19 = local_130->_M_local_buf + local_128;
      do {
        paVar15 = local_130;
        iVar7 = isspace((uint)(byte)pcVar19[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar15;
        if (iVar7 == 0) break;
        pcVar22 = pcVar19 + -1;
        uVar20 = (long)pcVar22 - (long)paVar15;
        std::__cxx11::string::_M_erase((ulong)&local_130,uVar20);
        pcVar19 = local_130->_M_local_buf + uVar20;
        local_b0._M_dataplus._M_p = (pointer)local_130;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar22 != paVar15);
    }
    local_130 = &local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_130) {
      local_b0.field_2._8_8_ = local_120._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_120._M_local_buf[0];
    local_b0._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ +
                      8),&local_b0);
    iVar7 = 0x6e2348;
    if (cVar9._M_node ==
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10))
    goto LAB_00442214;
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                         &local_b0);
    local_238 = &local_228;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_218 = pCVar10->line;
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x16;
    local_318._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_318,(ulong)&local_388);
    local_318.field_2._M_allocated_capacity = (size_type)local_388;
    *(undefined8 *)local_318._M_dataplus._M_p = 0x6543796669726556;
    *(undefined8 *)((long)local_318._M_dataplus._M_p + 8) = 0x7461636966697472;
    builtin_strncpy((char *)((long)local_318._M_dataplus._M_p + 0xe),"ateChain",8);
    local_318._M_string_length = (size_type)local_388;
    local_318._M_dataplus._M_p[(long)local_388] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_318);
    local_288 = &local_278;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_278._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_278._8_8_ = plVar11[3];
    }
    else {
      local_278._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_280 = (pointer)plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2f8 = &local_2e8;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2e8._8_8_ = plVar11[3];
    }
    else {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2f0 = (pointer)plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2b0 = &local_2a0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar15) {
      local_2a0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2a0._8_8_ = plVar11[3];
    }
    else {
      local_2a0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2a8 = plVar11[1];
    *plVar11 = (long)paVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_2b0,**(ulong **)local_210);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_340.field_2._M_allocated_capacity = *puVar16;
      local_340.field_2._8_8_ = plVar11[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar16;
      local_340._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_340._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar19 = strchr(pcVar8,0x2c);
    if (pcVar19 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,pcVar8,(allocator<char> *)&local_2d0);
      ptVar18 = extraout_RDX_04;
    }
    else {
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,pcVar8,pcVar19);
      ptVar18 = extraout_RDX_03;
    }
    _Var24._M_p = local_360._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar19 = (char *)(local_360._M_string_length + (long)local_360._M_dataplus._M_p);
      do {
        _Var4._M_p = local_360._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar19[-1]);
        ptVar18 = extraout_RDX_05;
        _Var24._M_p = _Var4._M_p;
        if (iVar7 == 0) break;
        pcVar22 = pcVar19 + -1;
        uVar20 = (long)pcVar22 - (long)_Var4._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_360,uVar20);
        pcVar19 = local_360._M_dataplus._M_p + uVar20;
        ptVar18 = extraout_RDX_06;
        _Var24._M_p = local_360._M_dataplus._M_p;
      } while (pcVar22 != _Var4._M_p);
    }
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    if (_Var24._M_p == local_360._M_dataplus._M_p) {
      local_378._8_8_ = local_360.field_2._8_8_;
      _Var24._M_p = (pointer)&local_378;
    }
    local_378._M_allocated_capacity = local_360.field_2._M_allocated_capacity;
    local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_string_length;
    local_360._M_string_length = 0;
    local_360.field_2._M_allocated_capacity =
         local_360.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p;
    GetTypeName_abi_cxx11_
              (&local_2d0,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate::typeinfo,ptVar18);
    _Var4._M_p = local_2d0._M_dataplus._M_p;
    local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0,local_238,local_230 + (long)local_238);
    iVar7 = local_218;
    paVar15 = local_238;
    local_3b0.line = local_218;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_260,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar15->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar15->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_260);
    }
    iVar7 = local_218;
    paVar15 = local_238;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_260,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar15->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar15->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_260);
    }
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006d0810;
    MakeAndRegisterTestInfo
              (&local_340,_Var24._M_p,_Var4._M_p,(char *)0x0,&local_3b0,
               &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
      operator_delete(local_3b0.file._M_dataplus._M_p,
                      local_3b0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_228._M_allocated_capacity;
    if (local_238 == &local_228) {
      local_1b8._8_8_ = local_228._8_8_;
      local_238 = &local_1b8;
    }
    local_1b8._M_allocated_capacity = local_228._M_allocated_capacity;
    local_1c0 = local_230;
    local_230 = 0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8 = local_218;
    paVar15 = &local_228;
    local_1c8 = local_238;
    if ((local_238 != &local_1b8) &&
       (local_238 = &local_228, operator_delete(local_1c8,uVar5 + 1), paVar15 = local_238,
       local_238 != &local_228)) {
      operator_delete(local_238,local_228._M_allocated_capacity + 1);
      paVar15 = local_238;
    }
    local_238 = paVar15;
    local_288 = &local_278;
    if (local_178 == &local_168) {
      local_278._8_8_ = local_168._8_8_;
    }
    else {
      local_288 = local_178;
    }
    local_278._M_allocated_capacity = local_168._M_allocated_capacity;
    local_280 = local_170;
    local_170 = (pointer)0x0;
    local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
    local_268 = local_158;
    local_178 = &local_168;
    pcVar8 = strchr(pcVar8,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
    pcVar19 = strchr(pcVar8,0x2c);
    if (pcVar19 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,pcVar8,(allocator<char> *)&local_3b0);
    }
    else {
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar8,pcVar19);
    }
    local_90._M_dataplus._M_p = (pointer)local_110;
    if (local_108 != 0) {
      pcVar19 = local_110->_M_local_buf + local_108;
      do {
        paVar15 = local_110;
        iVar7 = isspace((uint)(byte)pcVar19[-1]);
        local_90._M_dataplus._M_p = (pointer)paVar15;
        if (iVar7 == 0) break;
        pcVar22 = pcVar19 + -1;
        uVar20 = (long)pcVar22 - (long)paVar15;
        std::__cxx11::string::_M_erase((ulong)&local_110,uVar20);
        pcVar19 = local_110->_M_local_buf + uVar20;
        local_90._M_dataplus._M_p = (pointer)local_110;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar22 != paVar15);
    }
    local_110 = &local_100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == local_110) {
      local_90.field_2._8_8_ = local_100._8_8_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    local_90.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_90.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_90._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ +
                      8),&local_90);
    iVar7 = 0x6e2348;
    if (cVar9._M_node !=
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)) {
      pCVar10 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::
                           gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                           &local_90);
      local_2b0 = &local_2a0;
      pcVar2 = (pCVar10->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
      local_290 = pCVar10->line;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_2d0._M_dataplus._M_p = (pointer)0x16;
      local_360._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_2d0);
      local_360.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
      *(undefined8 *)local_360._M_dataplus._M_p = 0x6543796669726556;
      *(undefined8 *)((long)local_360._M_dataplus._M_p + 8) = 0x7461636966697472;
      builtin_strncpy((char *)((long)local_360._M_dataplus._M_p + 0xe),"ateChain",8);
      local_360._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
      local_360._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_360);
      local_388 = &local_378;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_378._M_allocated_capacity = *puVar16;
        local_378._8_8_ = plVar11[3];
      }
      else {
        local_378._M_allocated_capacity = *puVar16;
        local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_388);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      puVar16 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_318.field_2._M_allocated_capacity = *puVar16;
        local_318.field_2._8_8_ = puVar14[3];
      }
      else {
        local_318.field_2._M_allocated_capacity = *puVar16;
        local_318._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_318._M_string_length = puVar14[1];
      *puVar14 = puVar16;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_318);
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = plVar11[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_2f0 = (pointer)plVar11[1];
      *plVar11 = (long)paVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_2f8,**(ulong **)local_210);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_340.field_2._M_allocated_capacity = *puVar16;
        local_340.field_2._8_8_ = plVar11[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *puVar16;
        local_340._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_340._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pcVar19 = strchr(pcVar8,0x2c);
      if (pcVar19 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,pcVar8,(allocator<char> *)&local_1e8);
        ptVar18 = extraout_RDX_08;
      }
      else {
        local_260 = &local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,pcVar8,pcVar19);
        ptVar18 = extraout_RDX_07;
      }
      paVar15 = local_260;
      if (local_258 != (pointer)0x0) {
        pcVar19 = local_260->_M_local_buf + (long)local_258;
        do {
          paVar21 = local_260;
          iVar7 = isspace((uint)(byte)pcVar19[-1]);
          ptVar18 = extraout_RDX_09;
          paVar15 = paVar21;
          if (iVar7 == 0) break;
          pcVar22 = pcVar19 + -1;
          uVar20 = (long)pcVar22 - (long)paVar21;
          std::__cxx11::string::_M_erase((ulong)&local_260,uVar20);
          pcVar19 = local_260->_M_local_buf + uVar20;
          ptVar18 = extraout_RDX_10;
          paVar15 = local_260;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar22 != paVar21);
      }
      local_260 = &local_250;
      if (paVar15 == local_260) {
        local_2d0.field_2._8_8_ = local_250._8_8_;
        paVar15 = &local_2d0.field_2;
      }
      local_2d0.field_2._M_allocated_capacity = local_250._M_allocated_capacity;
      local_2d0._M_string_length = (size_type)local_258;
      local_258 = (pointer)0x0;
      local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
      GetTypeName_abi_cxx11_
                (&local_1e8,
                 (internal *)
                 &bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate::typeinfo,ptVar18)
      ;
      _Var24._M_p = local_1e8._M_dataplus._M_p;
      local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,local_2b0,local_2a8 + (long)local_2b0);
      iVar7 = local_290;
      paVar21 = local_2b0;
      local_3b0.line = local_290;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_208,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar12 = strlen(paVar21->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_208);
      }
      iVar7 = local_290;
      paVar21 = local_2b0;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_208,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar12 = strlen(paVar21->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_208);
      }
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006d08a8;
      MakeAndRegisterTestInfo
                (&local_340,paVar15->_M_local_buf,_Var24._M_p,(char *)0x0,&local_3b0,
                 &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
        operator_delete(local_3b0.file._M_dataplus._M_p,
                        local_3b0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,local_378._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_2a0._M_allocated_capacity;
      if (local_2b0 == &local_2a0) {
        local_1b8._8_8_ = local_2a0._8_8_;
        local_2b0 = &local_1b8;
      }
      local_1b8._M_allocated_capacity = local_2a0._M_allocated_capacity;
      local_1c0 = local_2a8;
      local_2a8 = 0;
      local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8 = local_290;
      paVar15 = &local_2a0;
      local_1c8 = local_2b0;
      if ((local_2b0 != &local_1b8) &&
         (local_2b0 = &local_2a0, operator_delete(local_1c8,uVar5 + 1), paVar15 = local_2b0,
         local_2b0 != &local_2a0)) {
        operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
        paVar15 = local_2b0;
      }
      local_2b0 = paVar15;
      local_2f8 = &local_2e8;
      if (local_288 == &local_278) {
        local_2e8._8_8_ = local_278._8_8_;
      }
      else {
        local_2f8 = local_288;
      }
      local_2e8._M_allocated_capacity = local_278._M_allocated_capacity;
      local_2f0 = local_280;
      local_280 = (pointer)0x0;
      local_278._M_allocated_capacity = local_278._M_allocated_capacity & 0xffffffffffffff00;
      local_2d8 = local_268;
      local_288 = &local_278;
      pcVar8 = strchr(pcVar8,0x2c);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar8 + 1);
          pcVar8 = pcVar8 + 1;
          iVar7 = isspace((uint)*pbVar1);
        } while (iVar7 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
      pcVar19 = strchr(pcVar8,0x2c);
      if (pcVar19 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,pcVar8,(allocator<char> *)&local_3b0);
      }
      else {
        local_f0 = (CodeLocation *)local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar8,pcVar19);
      }
      local_70._0_8_ = local_f0;
      if (local_e8 != 0) {
        pcVar19 = (char *)((long)&(local_f0->file)._M_dataplus._M_p + local_e8);
        do {
          pCVar10 = local_f0;
          iVar7 = isspace((uint)(byte)pcVar19[-1]);
          local_70._0_8_ = pCVar10;
          if (iVar7 == 0) break;
          pCVar23 = (CodeLocation *)(pcVar19 + -1);
          uVar20 = (long)pCVar23 - (long)pCVar10;
          std::__cxx11::string::_M_erase((ulong)&local_f0,uVar20);
          pcVar19 = (char *)(uVar20 + (long)local_f0);
          local_70._0_8_ = local_f0;
        } while (pCVar23 != pCVar10);
      }
      local_240 = (CodeLocation *)(local_70 + 0x10);
      local_f0 = (CodeLocation *)local_e0;
      if ((CodeLocation *)local_70._0_8_ == local_f0) {
        uStack_58 = local_e0._8_8_;
        local_70._0_8_ = local_240;
      }
      uStack_5f = local_e0._1_7_;
      local_70[0x10] = local_e0[0];
      local_70._8_8_ = local_e8;
      local_e8 = 0;
      local_e0[0] = 0;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                      *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_
                        + 8),(key_type *)local_70);
      iVar7 = 0x6e2348;
      if (cVar9._M_node !=
          (_Base_ptr)
          (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)) {
        pCVar10 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::
                             gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                             (string *)local_70);
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        pcVar2 = (pCVar10->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_340,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
        local_320 = pCVar10->line;
        local_260 = &local_250;
        local_1e8._M_dataplus._M_p = (pointer)0x16;
        local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_1e8);
        local_250._M_allocated_capacity = (size_type)local_1e8._M_dataplus._M_p;
        local_260->_M_allocated_capacity = 0x6543796669726556;
        (&local_260->_M_allocated_capacity)[1] = 0x7461636966697472;
        *(char *)((long)local_260 + 0xe) = 'a';
        *(char *)((long)local_260 + 0xf) = 't';
        *(char *)((long)local_260 + 0x10) = 'e';
        *(char *)((long)local_260 + 0x11) = 'C';
        *(char *)((long)local_260 + 0x12) = 'h';
        *(char *)((long)local_260 + 0x13) = 'a';
        *(char *)((long)local_260 + 0x14) = 'i';
        *(char *)((long)local_260 + 0x15) = 'n';
        local_258 = local_1e8._M_dataplus._M_p;
        local_260->_M_local_buf[(long)local_1e8._M_dataplus._M_p] = '\0';
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_260);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_2d0.field_2._M_allocated_capacity = *psVar17;
          local_2d0.field_2._8_8_ = plVar11[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar17;
          local_2d0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_2d0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_360.field_2._M_allocated_capacity = *psVar17;
          local_360.field_2._8_8_ = plVar11[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar17;
          local_360._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_360._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_360);
        local_388 = &local_378;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar15) {
          local_378._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_378._8_8_ = plVar11[3];
        }
        else {
          local_378._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11;
        }
        local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar11[1];
        *plVar11 = (long)paVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_388,**(ulong **)local_210);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_318.field_2._M_allocated_capacity = *psVar17;
          local_318.field_2._8_8_ = plVar11[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar17;
          local_318._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_318._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pcVar19 = strchr(pcVar8,0x2c);
        if (pcVar19 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,pcVar8,(allocator<char> *)local_50._M_local_buf);
          ptVar18 = extraout_RDX_12;
        }
        else {
          local_208 = &local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar8,pcVar19);
          ptVar18 = extraout_RDX_11;
        }
        paVar15 = local_208;
        if (local_200 != 0) {
          pcVar19 = local_208->_M_local_buf + local_200;
          do {
            paVar21 = local_208;
            iVar7 = isspace((uint)(byte)pcVar19[-1]);
            ptVar18 = extraout_RDX_13;
            paVar15 = paVar21;
            if (iVar7 == 0) break;
            pcVar22 = pcVar19 + -1;
            uVar20 = (long)pcVar22 - (long)paVar21;
            std::__cxx11::string::_M_erase((ulong)&local_208,uVar20);
            pcVar19 = local_208->_M_local_buf + uVar20;
            ptVar18 = extraout_RDX_14;
            paVar15 = local_208;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar22 != paVar21);
        }
        local_208 = &local_1f8;
        if (paVar15 == local_208) {
          local_1e8.field_2._8_8_ = local_1f8._8_8_;
          paVar15 = &local_1e8.field_2;
        }
        local_1e8.field_2._M_allocated_capacity._1_7_ = local_1f8._M_allocated_capacity._1_7_;
        local_1e8.field_2._M_local_buf[0] = local_1f8._M_local_buf[0];
        local_1e8._M_string_length = local_200;
        local_200 = 0;
        local_1f8._M_local_buf[0] = '\0';
        local_1e8._M_dataplus._M_p = (pointer)paVar15;
        GetTypeName_abi_cxx11_
                  ((string *)&local_50,
                   (internal *)
                   &bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate::typeinfo,
                   ptVar18);
        uVar5 = local_50._M_allocated_capacity;
        local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,local_340._M_dataplus._M_p,
                   local_340._M_dataplus._M_p + local_340._M_string_length);
        iVar7 = local_320;
        _Var24._M_p = local_340._M_dataplus._M_p;
        local_3b0.line = local_320;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_364,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var24._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar12 = strlen(_Var24._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var24._M_p,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_364);
        }
        iVar7 = local_320;
        _Var24._M_p = local_340._M_dataplus._M_p;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_364,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var24._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar12 = strlen(_Var24._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var24._M_p,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_364);
        }
        pTVar13 = (TestFactoryBase *)operator_new(8);
        pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006d0940;
        type_names_00 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
                 ::dummy_;
        pCVar10 = &local_3b0;
        MakeAndRegisterTestInfo
                  (&local_318,paVar15->_M_local_buf,(char *)uVar5,(char *)0x0,pCVar10,
                   &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
          operator_delete(local_3b0.file._M_dataplus._M_p,
                          local_3b0.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,
                          CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250._M_allocated_capacity + 1);
        }
        uVar5 = local_340.field_2._M_allocated_capacity;
        paVar15 = &local_340.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p == paVar15) {
          local_1b8._8_8_ = local_340.field_2._8_8_;
          local_340._M_dataplus._M_p = (pointer)&local_1b8;
        }
        local_1b8._M_allocated_capacity = local_340.field_2._M_allocated_capacity;
        local_1c0 = local_340._M_string_length;
        local_340._M_string_length = 0;
        local_340.field_2._M_allocated_capacity =
             local_340.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1a8 = local_320;
        _Var24._M_p = (pointer)paVar15;
        local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_340._M_dataplus._M_p != &local_1b8) &&
           (local_340._M_dataplus._M_p = (pointer)paVar15, operator_delete(local_1c8,uVar5 + 1),
           _Var24._M_p = local_340._M_dataplus._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_340._M_dataplus._M_p != paVar15)) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          _Var24._M_p = local_340._M_dataplus._M_p;
        }
        local_340._M_dataplus._M_p = _Var24._M_p;
        local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
        paVar15 = &local_2e8;
        if (local_2f8 == paVar15) {
          local_3b0.file.field_2._8_8_ = local_2e8._8_8_;
        }
        else {
          local_3b0.file._M_dataplus._M_p = (pointer)local_2f8;
        }
        local_3b0.file.field_2._M_allocated_capacity = local_2e8._M_allocated_capacity;
        local_3b0.file._M_string_length = (size_type)local_2f0;
        local_2f0 = (pointer)0x0;
        local_2e8._M_allocated_capacity = local_2e8._M_allocated_capacity & 0xffffffffffffff00;
        local_3b0.line = local_2d8;
        local_2f8 = paVar15;
        pCVar23 = (CodeLocation *)strchr(pcVar8,0x2c);
        if (pCVar23 == (CodeLocation *)0x0) {
          pCVar23 = (CodeLocation *)0x0;
        }
        else {
          do {
            psVar3 = &pCVar23->file;
            pCVar23 = (CodeLocation *)((long)&(pCVar23->file)._M_dataplus._M_p + 1);
            iVar7 = isspace((uint)*(byte *)((long)&(psVar3->_M_dataplus)._M_p + 1));
          } while (iVar7 != 0);
        }
        TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,_testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>_>
        ::Register((char *)&local_3b0,pCVar23,local_210,paVar15->_M_local_buf,(char *)pCVar10,
                   type_names_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
          operator_delete(local_3b0.file._M_dataplus._M_p,
                          local_3b0.file.field_2._M_allocated_capacity + 1);
        }
        if ((CodeLocation *)local_70._0_8_ != (CodeLocation *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_,stack0xffffffffffffffa0 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288,local_278._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._M_allocated_capacity + 1);
        }
        paVar15 = &local_c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._16_8_ != paVar15) {
          operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
          paVar15 = extraout_RAX;
        }
        return SUB81(paVar15,0);
      }
      goto LAB_0044228a;
    }
  }
  FormatFileLocation_abi_cxx11_
            (&local_3b0.file,(internal *)local_288->_M_local_buf,(char *)(ulong)local_268,iVar7);
  TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSignedUsingEcdsa,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Expired,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetNotEndEntity,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
  ::Register();
LAB_0044228a:
  FormatFileLocation_abi_cxx11_
            (&local_3b0.file,(internal *)local_2f8->_M_local_buf,(char *)(ulong)local_2d8,iVar7);
  TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSignedUsingEcdsa,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Expired,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetNotEndEntity,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ExtendedKeyUsage,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::IssuerAndSubjectNotByteForByteEqual,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TrustAnchorNotSelfSigned,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::KeyRollover,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>>
  ::Register();
  if ((CodeLocation *)local_70._0_8_ != (CodeLocation *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,(ulong)((local_240->file)._M_dataplus._M_p + 1));
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._16_8_ != &local_c0) {
    operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }